

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyParseTitle(TidyDocImpl *doc,Node *title,GetTokenMode mode)

{
  Bool BVar1;
  Node *node;
  
LAB_0013da8d:
  do {
    node = prvTidyGetToken(doc,MixedContent);
    if (node == (Node *)0x0) {
      prvTidyReport(doc,title,(Node *)0x0,0x25a);
      return (Node *)0x0;
    }
    if (node->tag == title->tag) {
      if (node->type == StartTag) {
        if (*(int *)((doc->config).value + 9) != 0) {
          prvTidyReport(doc,title,node,0x232);
          node->type = EndTag;
          prvTidyUngetToken(doc);
          goto LAB_0013da8d;
        }
      }
      else if (node->type == EndTag) {
        prvTidyFreeNode(doc,node);
        title->closed = yes;
        goto LAB_0013dbb2;
      }
    }
    BVar1 = prvTidynodeIsText(node);
    if (BVar1 == no) break;
    if (title->content == (Node *)0x0) {
      TrimInitialSpace(doc,title,node);
    }
    if (node->end <= node->start) goto LAB_0013db5b;
    prvTidyInsertNodeAtEnd(title,node);
  } while( true );
  BVar1 = InsertMisc(title,node);
  if (BVar1 == no) {
    if (node->tag != (Dict *)0x0) {
      prvTidyReport(doc,title,node,0x259);
      prvTidyUngetToken(doc);
LAB_0013dbb2:
      TrimSpaces(doc,title);
      return (Node *)0x0;
    }
    prvTidyReport(doc,title,node,0x235);
LAB_0013db5b:
    prvTidyFreeNode(doc,node);
  }
  goto LAB_0013da8d;
}

Assistant:

Node* TY_(ParseTitle)( TidyDocImpl* doc, Node *title, GetTokenMode ARG_UNUSED(mode) )
{
    Node *node;
    while ((node = TY_(GetToken)(doc, MixedContent)) != NULL)
    {
        if (node->tag == title->tag && node->type == StartTag
            && cfgBool(doc, TidyCoerceEndTags) )
        {
            TY_(Report)(doc, title, node, COERCE_TO_ENDTAG);
            node->type = EndTag;
            TY_(UngetToken)( doc );
            continue;
        }
        else if (node->tag == title->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            title->closed = yes;
            TrimSpaces(doc, title);
            return NULL;
        }

        if (TY_(nodeIsText)(node))
        {
            /* only called for 1st child */
            if (title->content == NULL)
                TrimInitialSpace(doc, title, node);

            if (node->start >= node->end)
            {
                TY_(FreeNode)( doc, node);
                continue;
            }

            TY_(InsertNodeAtEnd)(title, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(title, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(Report)(doc, title, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* pushback unexpected tokens */
        TY_(Report)(doc, title, node, MISSING_ENDTAG_BEFORE);
        TY_(UngetToken)( doc );
        TrimSpaces(doc, title);
        return NULL;
    }

    TY_(Report)(doc, title, node, MISSING_ENDTAG_FOR);
    return NULL;
}